

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall
ADPlanner::DeleteSearchStateSpace(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  CHeap *this_00;
  CMDPSTATE *pCVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (pSearchStateSpace->heap != (CHeap *)0x0) {
    CHeap::makeemptyheap(pSearchStateSpace->heap);
    this_00 = pSearchStateSpace->heap;
    if (this_00 != (CHeap *)0x0) {
      CHeap::~CHeap(this_00);
    }
    operator_delete(this_00,0x18);
    pSearchStateSpace->heap = (CHeap *)0x0;
  }
  if (pSearchStateSpace->inconslist != (CList *)0x0) {
    CList::makeemptylist(pSearchStateSpace->inconslist,0);
    operator_delete(pSearchStateSpace->inconslist,0x18);
    pSearchStateSpace->inconslist = (CList *)0x0;
  }
  uVar2 = (ulong)((long)(pSearchStateSpace->searchMDP).StateArray.
                        super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pSearchStateSpace->searchMDP).StateArray.
                       super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pCVar1 = (pSearchStateSpace->searchMDP).StateArray.
             super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1d])(this,pCVar1->PlannerSpecificData);
    free(pCVar1->PlannerSpecificData);
    pCVar1->PlannerSpecificData = (void *)0x0;
  }
  CMDP::Delete(&pSearchStateSpace->searchMDP);
  return;
}

Assistant:

void ADPlanner::DeleteSearchStateSpace(ADSearchStateSpace_t* pSearchStateSpace)
{
    if (pSearchStateSpace->heap != NULL) {
        pSearchStateSpace->heap->makeemptyheap();
        delete pSearchStateSpace->heap;
        pSearchStateSpace->heap = NULL;
    }

    if (pSearchStateSpace->inconslist != NULL) {
        pSearchStateSpace->inconslist->makeemptylist(AD_INCONS_LIST_ID);
        delete pSearchStateSpace->inconslist;
        pSearchStateSpace->inconslist = NULL;
    }

    //delete the states themselves
    int iend = (int)pSearchStateSpace->searchMDP.StateArray.size();
    for (int i = 0; i < iend; i++) {
        CMDPSTATE* state = pSearchStateSpace->searchMDP.StateArray[i];
        DeleteSearchStateData((ADState*)state->PlannerSpecificData);
        free(state->PlannerSpecificData); // allocated with malloc() on line 199 of revision 19485
        state->PlannerSpecificData = NULL;
    }
    pSearchStateSpace->searchMDP.Delete();
}